

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::Postprocess_BuildNode
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiNode *pSceneNode,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pSceneMeshList,
          list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pSceneMaterialList,
          list<aiLight_*,_std::allocator<aiLight_*>_> *pSceneLightList)

{
  EType EVar1;
  CX3DImporter_NodeElement *pNodeElement_00;
  _List_node_base *__n;
  undefined8 *******pppppppuVar2;
  _func_int **pp_Var3;
  pointer pcVar4;
  size_type sVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ulong uVar10;
  aiNode *this_00;
  _List_node_base *p_Var11;
  aiNode **ppaVar12;
  uint *puVar13;
  runtime_error *this_01;
  long *plVar14;
  long *plVar15;
  CX3DImporter_NodeElement_Group *tne_group;
  _List_node_base *p_Var16;
  const_iterator it;
  undefined8 *******pppppppuVar17;
  _List_node_base *p_Var18;
  uint uVar19;
  list<aiNode_*,_std::allocator<aiNode_*>_> SceneNode_Child;
  list<unsigned_int,_std::allocator<unsigned_int>_> SceneNode_Mesh;
  undefined8 *******local_c0;
  undefined8 *******local_b8;
  ulong local_b0;
  list<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var16 = (pNodeElement->Child).
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  local_c0 = &local_c0;
  local_b0 = 0;
  local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node._M_size = 0
  ;
  local_b8 = local_c0;
  local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
       super__List_node_base._M_next;
  Postprocess_CollectMetadata(this,pNodeElement,pSceneNode);
  p_Var18 = (_List_node_base *)&pNodeElement->Child;
  if (pNodeElement->Type == ENET_Group) {
    pp_Var3 = pNodeElement[1]._vptr_CX3DImporter_NodeElement;
    EVar1 = pNodeElement[1].Type;
    uVar9 = *(undefined4 *)&pNodeElement[1].field_0xc;
    pcVar4 = pNodeElement[1].ID._M_dataplus._M_p;
    uVar7 = *(undefined4 *)&pNodeElement[1].ID._M_string_length;
    uVar8 = *(undefined4 *)((long)&pNodeElement[1].ID._M_string_length + 4);
    sVar5 = pNodeElement[1].ID.field_2._M_allocated_capacity;
    uVar6 = *(undefined8 *)((long)&pNodeElement[1].ID.field_2 + 8);
    p_Var11 = pNodeElement[1].Child.
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    *(CX3DImporter_NodeElement **)&(pSceneNode->mTransformation).d1 = pNodeElement[1].Parent;
    *(_List_node_base **)&(pSceneNode->mTransformation).d3 = p_Var11;
    (pSceneNode->mTransformation).c1 = (float)(int)sVar5;
    (pSceneNode->mTransformation).c2 = (float)(int)(sVar5 >> 0x20);
    (pSceneNode->mTransformation).c3 = (float)(int)uVar6;
    (pSceneNode->mTransformation).c4 = (float)(int)((ulong)uVar6 >> 0x20);
    *(pointer *)&(pSceneNode->mTransformation).b1 = pcVar4;
    (pSceneNode->mTransformation).b3 = (float)uVar7;
    (pSceneNode->mTransformation).b4 = (float)uVar8;
    *(_func_int ***)&pSceneNode->mTransformation = pp_Var3;
    (pSceneNode->mTransformation).a3 = (float)EVar1;
    (pSceneNode->mTransformation).a4 = (float)uVar9;
    if (*(char *)((long)&pNodeElement[1].Child.
                         super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         ._M_impl._M_node.super__List_node_base._M_prev + 1) == '\x01') {
      uVar19 = *(uint *)((long)&pNodeElement[1].Child.
                                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 4);
      uVar10 = (ulong)uVar19;
      if (((int)uVar19 < 0) ||
         ((pNodeElement->Child).
          super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
          _M_impl._M_node._M_size <= uVar10)) goto LAB_0062cd5f;
      for (; uVar10 != 0; uVar10 = uVar10 - 1) {
        p_Var16 = p_Var16->_M_next;
      }
      p_Var18 = p_Var16->_M_next;
    }
  }
  for (; p_Var16 != p_Var18; p_Var16 = p_Var16->_M_next) {
    pNodeElement_00 = (CX3DImporter_NodeElement *)p_Var16[1]._M_next;
    EVar1 = pNodeElement_00->Type;
    if (EVar1 - ENET_DirectionalLight < 3) {
      Postprocess_BuildLight(this,pNodeElement_00,pSceneLightList);
    }
    else if (EVar1 == ENET_Shape) {
      Postprocess_BuildShape
                (this,(CX3DImporter_NodeElement_Shape *)pNodeElement_00,&local_a8,pSceneMeshList,
                 pSceneMaterialList);
    }
    else if (EVar1 == ENET_Group) {
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      p_Var11 = p_Var16[1]._M_next;
      __n = *(_List_node_base **)((long)(p_Var11 + 1) + 8);
      if (__n < (_List_node_base *)0x400) {
        (this_00->mName).length = (ai_uint32)__n;
        memcpy((this_00->mName).data,p_Var11[1]._M_next,(size_t)__n);
        (this_00->mName).data[(long)__n] = '\0';
      }
      this_00->mParent = pSceneNode;
      p_Var11 = (_List_node_base *)operator_new(0x18);
      p_Var11[1]._M_next = (_List_node_base *)this_00;
      std::__detail::_List_node_base::_M_hook(p_Var11);
      local_b0 = local_b0 + 1;
      Postprocess_BuildNode
                (this,(CX3DImporter_NodeElement *)p_Var16[1]._M_next,this_00,pSceneMeshList,
                 pSceneMaterialList,pSceneLightList);
    }
    else if (5 < EVar1 - ENET_MetaBoolean) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<CX3DImporter_NodeElement::EType>(&local_70,*(EType *)&(p_Var16[1]._M_next)->_M_prev)
      ;
      std::operator+(&local_50,"Postprocess_BuildNode. Unknown type: ",&local_70);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar14;
      plVar15 = plVar14 + 2;
      if (local_90 == plVar15) {
        local_80 = *plVar15;
        lStack_78 = plVar14[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar15;
      }
      local_88 = plVar14[1];
      *plVar14 = (long)plVar15;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::runtime_error::runtime_error(this_01,(string *)&local_90);
      *(undefined ***)this_01 = &PTR__runtime_error_00875f28;
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_0062cd5f:
  pppppppuVar17 = local_c0;
  if ((undefined8 ********)local_c0 != &local_c0) {
    uVar19 = (uint)local_b0;
    pSceneNode->mNumChildren = uVar19;
    ppaVar12 = (aiNode **)operator_new__((local_b0 & 0xffffffff) << 3);
    pSceneNode->mChildren = ppaVar12;
    if (uVar19 != 0) {
      uVar10 = 0;
      do {
        pppppppuVar2 = pppppppuVar17 + 2;
        pppppppuVar17 = (undefined8 *******)*pppppppuVar17;
        pSceneNode->mChildren[uVar10] = (aiNode *)*pppppppuVar2;
        uVar10 = uVar10 + 1;
      } while (uVar10 < pSceneNode->mNumChildren);
    }
  }
  p_Var18 = local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
            super__List_node_base._M_next;
  p_Var16 = p_Var18;
  if (local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_a8) {
    uVar19 = (uint)local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   _M_node._M_size;
    pSceneNode->mNumMeshes = uVar19;
    puVar13 = (uint *)operator_new__((local_a8.
                                      super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                      _M_impl._M_node._M_size & 0xffffffff) << 2);
    pSceneNode->mMeshes = puVar13;
    if (uVar19 != 0) {
      uVar10 = 0;
      do {
        p_Var16 = p_Var18 + 1;
        p_Var18 = p_Var18->_M_next;
        pSceneNode->mMeshes[uVar10] = *(uint *)&p_Var16->_M_next;
        uVar10 = uVar10 + 1;
        p_Var16 = local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  _M_node.super__List_node_base._M_next;
      } while (uVar10 < pSceneNode->mNumMeshes);
    }
  }
  while (pppppppuVar17 = local_c0, p_Var16 != (_List_node_base *)&local_a8) {
    p_Var18 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var16->_M_next)->
              _M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var16);
    p_Var16 = p_Var18;
  }
  while ((undefined8 ********)pppppppuVar17 != &local_c0) {
    pppppppuVar2 = (undefined8 *******)*pppppppuVar17;
    operator_delete(pppppppuVar17);
    pppppppuVar17 = pppppppuVar2;
  }
  return;
}

Assistant:

void X3DImporter::Postprocess_BuildNode(const CX3DImporter_NodeElement& pNodeElement, aiNode& pSceneNode, std::list<aiMesh*>& pSceneMeshList,
										std::list<aiMaterial*>& pSceneMaterialList, std::list<aiLight*>& pSceneLightList) const
{
    std::list<CX3DImporter_NodeElement*>::const_iterator chit_begin = pNodeElement.Child.begin();
    std::list<CX3DImporter_NodeElement*>::const_iterator chit_end = pNodeElement.Child.end();
    std::list<aiNode*> SceneNode_Child;
    std::list<unsigned int> SceneNode_Mesh;

	// At first read all metadata
	Postprocess_CollectMetadata(pNodeElement, pSceneNode);
	// check if we have deal with grouping node. Which can contain transformation or switch
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Group)
	{
		const CX3DImporter_NodeElement_Group& tne_group = *((CX3DImporter_NodeElement_Group*)&pNodeElement);// create alias for convenience

		pSceneNode.mTransformation = tne_group.Transformation;
		if(tne_group.UseChoice)
		{
			// If Choice is less than zero or greater than the number of nodes in the children field, nothing is chosen.
			if((tne_group.Choice < 0) || ((size_t)tne_group.Choice >= pNodeElement.Child.size()))
			{
				chit_begin = pNodeElement.Child.end();
				chit_end = pNodeElement.Child.end();
			}
			else
			{
				for(size_t i = 0; i < (size_t)tne_group.Choice; i++) ++chit_begin;// forward iterator to chosen node.

				chit_end = chit_begin;
				++chit_end;// point end iterator to next element after chosen node.
			}
		}// if(tne_group.UseChoice)
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Group)

	// Reserve memory for fast access and check children.
	for(std::list<CX3DImporter_NodeElement*>::const_iterator it = chit_begin; it != chit_end; ++it)
	{// in this loop we do not read metadata because it's already read at begin.
		if((*it)->Type == CX3DImporter_NodeElement::ENET_Group)
		{
			// if child is group then create new node and do recursive call.
			aiNode* new_node = new aiNode;

			new_node->mName = (*it)->ID;
			new_node->mParent = &pSceneNode;
			SceneNode_Child.push_back(new_node);
			Postprocess_BuildNode(**it, *new_node, pSceneMeshList, pSceneMaterialList, pSceneLightList);
		}
		else if((*it)->Type == CX3DImporter_NodeElement::ENET_Shape)
		{
			// shape can contain only one geometry and one appearance nodes.
			Postprocess_BuildShape(*((CX3DImporter_NodeElement_Shape*)*it), SceneNode_Mesh, pSceneMeshList, pSceneMaterialList);
		}
		else if(((*it)->Type == CX3DImporter_NodeElement::ENET_DirectionalLight) || ((*it)->Type == CX3DImporter_NodeElement::ENET_PointLight) ||
				((*it)->Type == CX3DImporter_NodeElement::ENET_SpotLight))
		{
			Postprocess_BuildLight(*((CX3DImporter_NodeElement_Light*)*it), pSceneLightList);
		}
		else if(!PostprocessHelper_ElementIsMetadata((*it)->Type))// skip metadata
		{
			throw DeadlyImportError("Postprocess_BuildNode. Unknown type: " + to_string((*it)->Type) + ".");
		}
	}// for(std::list<CX3DImporter_NodeElement*>::const_iterator it = chit_begin; it != chit_end; it++)

	// copy data about children and meshes to aiNode.
	if(!SceneNode_Child.empty())
	{
		std::list<aiNode*>::const_iterator it = SceneNode_Child.begin();

		pSceneNode.mNumChildren = static_cast<unsigned int>(SceneNode_Child.size());
		pSceneNode.mChildren = new aiNode*[pSceneNode.mNumChildren];
		for(size_t i = 0; i < pSceneNode.mNumChildren; i++) pSceneNode.mChildren[i] = *it++;
	}

	if(!SceneNode_Mesh.empty())
	{
		std::list<unsigned int>::const_iterator it = SceneNode_Mesh.begin();

		pSceneNode.mNumMeshes = static_cast<unsigned int>(SceneNode_Mesh.size());
		pSceneNode.mMeshes = new unsigned int[pSceneNode.mNumMeshes];
		for(size_t i = 0; i < pSceneNode.mNumMeshes; i++) pSceneNode.mMeshes[i] = *it++;
	}

	// that's all. return to previous deals
}